

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbgfx_test.cpp
# Opt level: O0

void __thiscall Png::~Png(Png *this)

{
  Png *this_local;
  
  png_destroy_read_struct(&this->png,&this->info,0);
  std::vector<Rgba,_default_init_allocator<Rgba,_std::allocator<Rgba>_>_>::~vector(&this->pixels);
  std::filebuf::~filebuf(&this->file);
  return;
}

Assistant:

~Png() { png_destroy_read_struct(&png, &info, nullptr); }